

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O0

SmallHeapBlockBitVector * __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::EnsureFreeBitVector
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this,bool isCollecting)

{
  bool bVar1;
  bool isCollecting_local;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *this_local;
  
  bVar1 = IsFreeBitsValid(this);
  if (bVar1) {
    CheckFreeBitVector(this,isCollecting);
    this_local = (SmallHeapBlockT<MediumAllocationBlockAttributes> *)GetFreeBitVector(this);
  }
  else {
    this_local = (SmallHeapBlockT<MediumAllocationBlockAttributes> *)BuildFreeBitVector(this);
  }
  return (SmallHeapBlockBitVector *)this_local;
}

Assistant:

typename SmallHeapBlockT<TBlockAttributes>::SmallHeapBlockBitVector *
SmallHeapBlockT<TBlockAttributes>::EnsureFreeBitVector(bool isCollecting)
{
    if (this->IsFreeBitsValid())
    {
        // the free object list hasn't change, so the free vector should be valid
        RECYCLER_SLOW_CHECK(CheckFreeBitVector(isCollecting));
        return this->GetFreeBitVector();
    }
    return BuildFreeBitVector();
}